

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WildLCS.cpp
# Opt level: O2

vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
* __thiscall
WildLCS::gen_rules_abi_cxx11_
          (vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *__return_storage_ptr__,WildLCS *this)

{
  int iVar1;
  pointer ppVar2;
  __type _Var3;
  pointer pvVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  int iVar8;
  int k;
  long lVar9;
  long lVar10;
  pointer ppVar11;
  long lVar12;
  pointer pbVar13;
  int j;
  ulong uVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lhs;
  int new_node;
  undefined4 uStack_134;
  pointer pbStack_130;
  pointer local_128;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  H;
  vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
  used;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  cur_H;
  vector<int,_std::allocator<int>_> token_id;
  string cur_string;
  unordered_set<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_rule_hash,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  rules;
  
  rules._M_h._M_buckets = &rules._M_h._M_single_bucket;
  rules._M_h._M_bucket_count = 1;
  rules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  rules._M_h._M_element_count = 0;
  rules._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  rules._M_h._M_rehash_policy._M_next_resize = 0;
  rules._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(&used,((long)(this->trie).
                        super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->trie).
                       super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x38,(allocator_type *)&cur_H);
  H.
  super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  H.
  super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  H.
  super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar12 = 0;
  while( true ) {
    if ((this->super_RuleGenerator).n <= lVar12) break;
    std::__cxx11::string::string((string *)&cur_string,"",(allocator *)&cur_H);
    token_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    token_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    token_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pvVar4 = (this->super_RuleGenerator).tokens.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = *(long *)&pvVar4[lVar12].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data;
    iVar8 = 0;
    while( true ) {
      cur_H.
      super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(cur_H.
                             super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar8);
      if ((int)((ulong)((long)*(pointer *)
                               ((long)&pvVar4[lVar12].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar10) >> 5) <=
          iVar8) break;
      for (lVar9 = 0; lVar9 < *(int *)(lVar10 + 8 + (long)iVar8 * 0x20); lVar9 = lVar9 + 1) {
        std::__cxx11::string::push_back((char)&cur_string);
        std::vector<int,_std::allocator<int>_>::push_back(&token_id,(value_type_conflict1 *)&cur_H);
        pvVar4 = (this->super_RuleGenerator).tokens.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = *(long *)&pvVar4[lVar12].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data;
        iVar8 = (int)cur_H.
                     super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      }
      iVar8 = iVar8 + 1;
    }
    if (H.
        super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        H.
        super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      H.
      super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           H.
           super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    lVar10 = 0;
    for (uVar14 = 0;
        uVar14 < (ulong)(((long)(this->trie).
                                super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->trie).
                               super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x38);
        uVar14 = uVar14 + 1) {
      std::
      _Hashtable<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_pairii_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear((_Hashtable<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_pairii_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)((long)&((used.
                           super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_h)._M_buckets + lVar10));
      lVar10 = lVar10 + 0x38;
    }
    lhs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)lhs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    cur_H.
    super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
    ::emplace_back<int,std::pair<int,int>>
              ((vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                *)&H,(int *)&lhs,(value_type *)&cur_H);
    cur_H.
    super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::__detail::
    _Insert<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_pairii_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_pairii_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)used.
                super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,(value_type *)&cur_H);
    for (uVar14 = 0;
        ppVar2 = H.
                 super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        ppVar11 = H.
                  super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, uVar14 < cur_string._M_string_length;
        uVar14 = uVar14 + 1) {
      std::
      vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
      ::vector(&cur_H,&H);
      ppVar2 = cur_H.
               super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar11 = cur_H.
                     super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar2;
          ppVar11 = ppVar11 + 1) {
        iVar8 = ppVar11->first;
        iVar1 = (ppVar11->second).first;
        sVar5 = std::
                _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(&(this->trie).
                         super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar8]._M_h,
                        cur_string._M_dataplus._M_p + uVar14);
        if (sVar5 != 0) {
          pmVar6 = std::__detail::
                   _Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)((this->trie).
                                    super__Vector_base<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>,_std::allocator<std::unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + iVar8),
                                cur_string._M_dataplus._M_p + uVar14);
          _new_node = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(uStack_134,*pmVar6);
          if (iVar1 == 0) {
            iVar1 = token_id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar14] + 1;
          }
          pbVar13 = (pointer)CONCAT44(token_id.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[uVar14] + 1,iVar1);
          lhs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar13;
          sVar7 = std::
                  _Hashtable<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_pairii_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(&used.
                           super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[*pmVar6]._M_h,(key_type *)&lhs)
          ;
          if (sVar7 == 0) {
            lhs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = pbVar13;
            std::
            vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
            ::emplace_back<int&,std::pair<int,int>>
                      ((vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                        *)&H,&new_node,(pair<int,_int> *)&lhs);
            lhs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = pbVar13;
            std::__detail::
            _Insert<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_pairii_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
            ::insert((_Insert<std::pair<int,_int>,_std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>,_std::__detail::_Identity,_std::equal_to<std::pair<int,_int>_>,_pairii_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                      *)(used.
                         super__Vector_base<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + new_node),(value_type *)&lhs);
          }
        }
      }
      std::
      _Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
      ::~_Vector_base(&cur_H.
                       super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                     );
    }
    for (; ppVar11 != ppVar2; ppVar11 = ppVar11 + 1) {
      pbVar13 = (this->contain_word).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pbVar13[ppVar11->first]._M_string_length != 0) {
        iVar8 = (ppVar11->second).first;
        iVar1 = (ppVar11->second).second;
        lhs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        lhs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        lhs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        _new_node = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        pbStack_130 = (pointer)0x0;
        local_128 = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&lhs,pbVar13 + ppVar11->first);
        lVar9 = (long)(iVar8 + -1);
        lVar10 = lVar9 << 5;
        for (; lVar9 < iVar1; lVar9 = lVar9 + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&new_node,
                      (value_type *)
                      (*(long *)&(this->super_RuleGenerator).tokens.
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar12].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data + lVar10));
          lVar10 = lVar10 + 0x20;
        }
        if (((long)pbStack_130 - (long)_new_node != 0x20) ||
           (_Var3 = std::operator==(lhs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,_new_node), !_Var3)) {
          std::
          pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::
          pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
                    ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&cur_H,&lhs,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&new_node);
          std::__detail::
          _Insert<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Identity,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_rule_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Identity,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_rule_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)&rules,
                   (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&cur_H);
          std::
          pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~pair((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&cur_H);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&new_node);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&lhs);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&token_id.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::string::~string((string *)&cur_string);
    lVar12 = lVar12 + 1;
  }
  std::
  vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
  ::
  vector<std::__detail::_Node_iterator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,true,true>,void>
            ((vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              *)__return_storage_ptr__,
             (_Node_iterator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>
              )rules._M_h._M_before_begin._M_nxt,
             (_Node_iterator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>
              )0x0,(allocator_type *)&cur_H);
  std::
  _Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  ::~_Vector_base(&H.
                   super__Vector_base<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
                 );
  std::
  vector<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::unordered_set<std::pair<int,_int>,_pairii_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&used);
  std::
  _Hashtable<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Identity,_std::equal_to<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_rule_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&rules._M_h);
  return __return_storage_ptr__;
}

Assistant:

vector<t_rule> WildLCS::gen_rules()
{
	unordered_set<t_rule, rule_hash> rules;
	vector<unordered_set<pair<int, int>, pairii_hash>> used(trie.size());
	vector<pair<int, pair<int, int>>> H;

	for (int i = 0; i < n; i ++)
	{
		string cur_string = "";
		vector<int> token_id;

		for (int j = 0; j < (int) tokens[i].size(); j ++)
			for (int k = 0; k < (int) tokens[i][j].size(); k ++)
			{
				cur_string += tokens[i][j][k];
				token_id.push_back(j);
			}

		//traversal
		H.clear();
		for (auto j = 0; j < trie.size(); j ++)
			used[j].clear();
		H.emplace_back(0, make_pair(0, 0));
		used[0].insert(make_pair(0, 0));
		for (auto j = 0; j < cur_string.size(); j ++)
		{
			vector<pair<int, pair<int, int>>> cur_H = H;
			for (auto cp : cur_H)
			{
				int node = cp.first;
				int st = cp.second.first;
				int en = cp.second.second;

				//include current character
				if (trie[node].count(cur_string[j]))
				{
					int new_node = trie[node][cur_string[j]];
					int new_st = (st == 0 ? token_id[j] + 1 : st);
					int new_en = token_id[j] + 1;
					if (! used[new_node].count(make_pair(new_st, new_en)))
					{
						H.emplace_back(new_node, make_pair(new_st, new_en));
						used[new_node].insert(make_pair(new_st, new_en));
					}
				}
			}
		}

		//output rules
		for (auto cp : H)
		{
			int node = cp.first;
			int st = cp.second.first;
			int en = cp.second.second;
			if (! contain_word[node].size())
				continue;
			vector<string> lhs, rhs;
			lhs.push_back(contain_word[node]);
			for (int j = st - 1; j < en; j ++)
				rhs.push_back(tokens[i][j]);

			//get rid of identity rules
			if (rhs.size() == 1 && lhs[0] == rhs[0])
				continue;

			rules.insert(make_pair(lhs, rhs));
		}
	}

	return vector<t_rule>(rules.begin(), rules.end());
}